

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<double,double,double,duckdb::BothInclusiveBetweenOperator,false,false,true>
                (double *adata,double *bdata,double *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  ulong uVar2;
  double dVar3;
  idx_t i;
  double dVar4;
  double row_idx;
  double row_idx_00;
  double row_idx_01;
  long lVar5;
  double in_stack_ffffffffffffff98;
  
  lVar5 = 0;
  for (dVar4 = 0.0; (double)count != dVar4; dVar4 = (double)((long)dVar4 + 1)) {
    dVar3 = dVar4;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      dVar3 = (double)(ulong)result_sel->sel_vector[(long)dVar4];
    }
    row_idx_01 = dVar4;
    if (asel->sel_vector != (sel_t *)0x0) {
      row_idx_01 = (double)(ulong)asel->sel_vector[(long)dVar4];
    }
    row_idx = dVar4;
    if (bsel->sel_vector != (sel_t *)0x0) {
      row_idx = (double)(ulong)bsel->sel_vector[(long)dVar4];
    }
    row_idx_00 = dVar4;
    if (csel->sel_vector != (sel_t *)0x0) {
      row_idx_00 = (double)(ulong)csel->sel_vector[(long)dVar4];
    }
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&avalidity->super_TemplatedValidityMask<unsigned_long>,(idx_t)row_idx_01);
    uVar2 = 1;
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&bvalidity->super_TemplatedValidityMask<unsigned_long>,(idx_t)row_idx);
      uVar2 = 1;
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,(idx_t)row_idx_00)
        ;
        uVar2 = 1;
        if (bVar1) {
          bVar1 = BothInclusiveBetweenOperator::Operation<double>
                            (in_stack_ffffffffffffff98,(double)count,1.24044231671077e-316);
          uVar2 = (ulong)!bVar1;
        }
      }
    }
    false_sel->sel_vector[lVar5] = SUB84(dVar3,0);
    lVar5 = lVar5 + uVar2;
  }
  return count - lVar5;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}